

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * ysimple_name(obj *obj)

{
  char *pcVar1;
  size_t sVar2;
  char *__src;
  int space_left;
  char *s;
  char *outbuf;
  obj *obj_local;
  
  pcVar1 = nextobuf();
  pcVar1 = shk_your(pcVar1,obj);
  sVar2 = strlen(pcVar1);
  pcVar1 = strcat(pcVar1," ");
  __src = simple_typename((int)obj->otyp);
  pcVar1 = strncat(pcVar1,__src,(long)(0xfe - (int)sVar2));
  return pcVar1;
}

Assistant:

char *ysimple_name(const struct obj *obj)
{
	char *outbuf = nextobuf();
	char *s = shk_your(outbuf, obj);	/* assert( s == outbuf ); */
	int space_left = BUFSZ - strlen(s) - sizeof " ";

	return strncat(strcat(s, " "), simple_typename(obj->otyp), space_left);
}